

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

double P_InterceptVector(divline_t *v2,divline_t *v1)

{
  double dVar1;
  double v2dy;
  double v2dx;
  double v2y;
  double v2x;
  double v1dy;
  double v1dx;
  double v1y;
  double v1x;
  double den;
  double num;
  divline_t *v1_local;
  divline_t *v2_local;
  
  dVar1 = v1->dy * v2->dx - v1->dx * v2->dy;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    v2_local = (divline_t *)(((v1->x - v2->x) * v1->dy + (v2->y - v1->y) * v1->dx) / dVar1);
  }
  else {
    v2_local = (divline_t *)0x0;
  }
  return (double)v2_local;
}

Assistant:

double P_InterceptVector(const divline_t *v2, const divline_t *v1)
{
	double num;
	double den;

	double v1x = v1->x;
	double v1y = v1->y;
	double v1dx = v1->dx;
	double v1dy = v1->dy;
	double v2x = v2->x;
	double v2y = v2->y;
	double v2dx = v2->dx;
	double v2dy = v2->dy;

	den = v1dy*v2dx - v1dx*v2dy;

	if (den == 0)
		return 0;		// parallel

	num = (v1x - v2x)*v1dy + (v2y - v1y)*v1dx;
	return num / den;
}